

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchARGBPMToRGBA32F<(QImage::Format)18>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  uint uVar1;
  uint6 uVar2;
  long lVar3;
  
  if (0 < count) {
    lVar3 = 0;
    do {
      uVar1 = *(uint *)(src + lVar3 + (long)index * 4);
      uVar2 = CONCAT24((short)(uVar1 >> 8),uVar1) & 0xff000000ff;
      *(ulong *)(&buffer->r + lVar3) =
           CONCAT44((float)(ushort)(uVar2 >> 0x20) * 0.003921569,(float)(int)uVar2 * 0.003921569);
      *(ulong *)(&buffer->r + lVar3 + 2) =
           CONCAT44((float)(uVar1 >> 0x18) * 0.003921569,(float)(uVar1 >> 0x10 & 0xff) * 0.003921569
                   );
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)count << 2 != lVar3);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBPMToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                        const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i));
    return buffer;
}